

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# core.h
# Opt level: O3

tensor * __thiscall
dlib::
add_layer<dlib::con_<64L,_1L,_1L,_1,_1,_0,_0>,_dlib::add_tag_layer<1UL,_dlib::impl::repeat_input_layer,_void>,_void>
::forward(add_layer<dlib::con_<64L,_1L,_1L,_1,_1,_0,_0>,_dlib::add_tag_layer<1UL,_dlib::impl::repeat_input_layer,_void>,_void>
          *this,tensor *x)

{
  add_tag_layer<1UL,_dlib::impl::repeat_input_layer,_void> *paVar1;
  subnet_wrapper<dlib::add_tag_layer<1UL,_dlib::impl::repeat_input_layer,_void>,_true,_void> wsub;
  subnet_wrapper<dlib::add_tag_layer<1UL,_dlib::impl::repeat_input_layer,_void>,_true,_void>
  local_28;
  
  paVar1 = (this->subnetwork)._M_t.
           super___uniq_ptr_impl<dlib::add_tag_layer<1UL,_dlib::impl::repeat_input_layer,_void>,_std::default_delete<dlib::add_tag_layer<1UL,_dlib::impl::repeat_input_layer,_void>_>_>
           ._M_t.
           super__Tuple_impl<0UL,_dlib::add_tag_layer<1UL,_dlib::impl::repeat_input_layer,_void>_*,_std::default_delete<dlib::add_tag_layer<1UL,_dlib::impl::repeat_input_layer,_void>_>_>
           .
           super__Head_base<0UL,_dlib::add_tag_layer<1UL,_dlib::impl::repeat_input_layer,_void>_*,_false>
           ._M_head_impl;
  paVar1->cached_output_ptr = x;
  paVar1->gradient_input_is_stale = true;
  local_28.l = (this->subnetwork)._M_t.
               super___uniq_ptr_impl<dlib::add_tag_layer<1UL,_dlib::impl::repeat_input_layer,_void>,_std::default_delete<dlib::add_tag_layer<1UL,_dlib::impl::repeat_input_layer,_void>_>_>
               ._M_t.
               super__Tuple_impl<0UL,_dlib::add_tag_layer<1UL,_dlib::impl::repeat_input_layer,_void>_*,_std::default_delete<dlib::add_tag_layer<1UL,_dlib::impl::repeat_input_layer,_void>_>_>
               .
               super__Head_base<0UL,_dlib::add_tag_layer<1UL,_dlib::impl::repeat_input_layer,_void>_*,_false>
               ._M_head_impl;
  local_28.subnetwork._sample_expansion_factor = (local_28.l)->_sample_expansion_factor;
  local_28.subnetwork.l = (repeat_input_layer *)local_28.l;
  if (this->this_layer_setup_called == false) {
    con_<64l,1l,1l,1,1,0,0>::
    setup<dlib::dimpl::subnet_wrapper<dlib::add_tag_layer<1ul,dlib::impl::repeat_input_layer,void>,true,void>>
              ((con_<64l,1l,1l,1,1,0,0> *)this,&local_28);
    this->this_layer_setup_called = true;
  }
  con_<64l,1l,1l,1,1,0,0>::
  forward<dlib::dimpl::subnet_wrapper<dlib::add_tag_layer<1ul,dlib::impl::repeat_input_layer,void>,true,void>>
            ((con_<64l,1l,1l,1,1,0,0> *)this,&local_28,&this->cached_output);
  this->gradient_input_is_stale = true;
  return &(this->cached_output).super_tensor;
}

Assistant:

const tensor& forward(const tensor& x)
        {
            subnetwork->forward(x);
            const dimpl::subnet_wrapper<subnet_type> wsub(*subnetwork);
            if (!this_layer_setup_called)
            {
                details.setup(wsub);
                this_layer_setup_called = true;
            }
            if (this_layer_operates_inplace())
                impl::call_layer_forward(details, wsub, private_get_output());
            else
                impl::call_layer_forward(details, wsub, cached_output);

            gradient_input_is_stale = true;
            return private_get_output();
        }